

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinetics-observer.cpp
# Opt level: O0

void __thiscall
stateObservation::KineticsObserver::setContactProcessCovMat
          (KineticsObserver *this,int contactNbr,Matrix12 *contactCovMat)

{
  uint blockIndex;
  Matrix local_50;
  undefined1 local_38 [8];
  Matrix P;
  Matrix12 *contactCovMat_local;
  int contactNbr_local;
  KineticsObserver *this_local;
  
  P.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)contactCovMat;
  KalmanFilterBase::getProcessCovariance((Matrix *)local_38,&(this->ekf_).super_KalmanFilterBase);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,12,12,0,12,12>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_50,
             (EigenBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_> *)
             P.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  blockIndex = contactIndexTangent(this,contactNbr);
  setBlockStateCovariance<12>((Matrix *)local_38,&local_50,blockIndex);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_50);
  KalmanFilterBase::setProcessCovariance(&(this->ekf_).super_KalmanFilterBase,(Qmatrix *)local_38);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_38);
  return;
}

Assistant:

void KineticsObserver::setContactProcessCovMat(int contactNbr, const Matrix12 & contactCovMat)
{
  Matrix P = ekf_.getProcessCovariance();
  setBlockStateCovariance<sizeContactTangent>(P, contactCovMat, contactIndexTangent(contactNbr));
  ekf_.setProcessCovariance(P);
}